

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

string * __thiscall
google::anon_unknown_1::CommandLineFlagParser::ProcessOptionsFromStringLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *contentdata,
          FlagSettingMode set_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  _Alloc_hider __pattern;
  char cVar4;
  int iVar5;
  char *pcVar6;
  CommandLineFlag *flag;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  string line;
  string key;
  string error_message;
  char *value;
  char *local_c8;
  long local_c0;
  char local_b8 [16];
  CommandLineFlagParser *local_a8;
  string local_a0;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  char *local_58;
  string local_50;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar10 = (contentdata->_M_dataplus)._M_p;
  if (pcVar10 != (char *)0x0) {
    paVar1 = &local_a0.field_2;
    bVar2 = true;
    bVar3 = false;
    local_a8 = this;
    do {
      cVar4 = *pcVar10;
      while ((cVar4 != '\0' && (iVar5 = isspace((int)cVar4), iVar5 != 0))) {
        cVar4 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
      }
      pcVar6 = strchr(pcVar10,10);
      if (pcVar6 == (char *)0x0) {
        sVar9 = strlen(pcVar10);
      }
      else {
        sVar9 = (long)pcVar6 - (long)pcVar10;
      }
      local_c8 = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar10,pcVar10 + sVar9);
      if ((local_c0 != 0) && (*local_c8 != '#')) {
        if (*local_c8 == '-') {
          if (bVar2) {
            pcVar10 = local_c8 + 1;
            if (local_c8[1] == '-') {
              pcVar10 = local_c8 + 2;
            }
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            local_80._M_string_length = 0;
            local_80.field_2._M_local_buf[0] = '\0';
            local_a0._M_dataplus._M_p = (pointer)paVar1;
            flag = FlagRegistry::SplitArgumentLocked
                             (local_a8->registry_,pcVar10,&local_a0,&local_58,&local_80);
            if (local_58 != (char *)0x0 && flag != (CommandLineFlag *)0x0) {
              (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                        (&local_50,local_a8,flag,local_58,set_mode);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            bVar3 = false;
          }
          else {
            bVar3 = false;
          }
        }
        else {
          if (!bVar3) {
            bVar2 = false;
          }
          if (!bVar3) {
            bVar3 = true;
          }
          cVar4 = *local_c8;
          pcVar10 = local_c8;
          while ((cVar4 != '\0' && (!bVar2))) {
            pcVar7 = strchr(pcVar10,0x20);
            if (pcVar7 == (char *)0x0) {
              sVar9 = strlen(pcVar10);
              pcVar7 = pcVar10 + sVar9;
            }
            local_a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pcVar10,pcVar7);
            iVar5 = std::__cxx11::string::compare((char *)&local_a0);
            if (iVar5 == 0) {
LAB_00190f3d:
              bVar2 = true;
            }
            else {
              std::__cxx11::string::rfind('@',0x2f);
              iVar5 = std::__cxx11::string::compare((char *)&local_a0);
              if ((iVar5 == 0) ||
                 (iVar5 = fnmatch(local_a0._M_dataplus._M_p,argv0_abi_cxx11_,1),
                 __pattern._M_p = local_a0._M_dataplus._M_p, iVar5 == 0)) goto LAB_00190f3d;
              lVar8 = std::__cxx11::string::rfind('@',0x2f);
              pcVar10 = argv0_abi_cxx11_ + lVar8 + 1;
              if (lVar8 == -1) {
                pcVar10 = argv0_abi_cxx11_;
              }
              iVar5 = fnmatch(__pattern._M_p,pcVar10,1);
              if (iVar5 == 0) goto LAB_00190f3d;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            pcVar10 = pcVar7 + 1;
            cVar4 = *pcVar7;
          }
        }
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
      pcVar10 = pcVar6 + 1;
    } while (pcVar6 != (char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

string CommandLineFlagParser::ProcessOptionsFromStringLocked(
    const string& contentdata, FlagSettingMode set_mode) {
  string retval;
  const char* flagfile_contents = contentdata.c_str();
  bool flags_are_relevant = true;   // set to false when filenames don't match
  bool in_filename_section = false;

  const char* line_end = flagfile_contents;
  // We read this file a line at a time.
  for (; line_end; flagfile_contents = line_end + 1) {
    while (*flagfile_contents && isspace(*flagfile_contents))
      ++flagfile_contents;
    line_end = strchr(flagfile_contents, '\n');
    size_t len = line_end ? line_end - flagfile_contents
                          : strlen(flagfile_contents);
    string line(flagfile_contents, len);

    // Each line can be one of four things:
    // 1) A comment line -- we skip it
    // 2) An empty line -- we skip it
    // 3) A list of filenames -- starts a new filenames+flags section
    // 4) A --flag=value line -- apply if previous filenames match
    if (line.empty() || line[0] == '#') {
      // comment or empty line; just ignore

    } else if (line[0] == '-') {    // flag
      in_filename_section = false;  // instead, it was a flag-line
      if (!flags_are_relevant)      // skip this flag; applies to someone else
        continue;

      const char* name_and_val = line.c_str() + 1;    // skip the leading -
      if (*name_and_val == '-')
        name_and_val++;                               // skip second - too
      string key;
      const char* value;
      string error_message;
      CommandLineFlag* flag = registry_->SplitArgumentLocked(name_and_val,
                                                             &key, &value,
                                                             &error_message);
      // By API, errors parsing flagfile lines are silently ignored.
      if (flag == NULL) {
        // "WARNING: flagname '" + key + "' not found\n"
      } else if (value == NULL) {
        // "WARNING: flagname '" + key + "' missing a value\n"
      } else {
        retval += ProcessSingleOptionLocked(flag, value, set_mode);
      }

    } else {                        // a filename!
      if (!in_filename_section) {   // start over: assume filenames don't match
        in_filename_section = true;
        flags_are_relevant = false;
      }

      // Split the line up at spaces into glob-patterns
      const char* space = line.c_str();   // just has to be non-NULL
      for (const char* word = line.c_str(); *space; word = space+1) {
        if (flags_are_relevant)     // we can stop as soon as we match
          break;
        space = strchr(word, ' ');
        if (space == NULL)
          space = word + strlen(word);
        const string glob(word, space - word);
        // We try matching both against the full argv0 and basename(argv0)
        if (glob == ProgramInvocationName()       // small optimization
            || glob == ProgramInvocationShortName()
#if defined(HAVE_FNMATCH_H)
            || fnmatch(glob.c_str(), ProgramInvocationName(),      FNM_PATHNAME) == 0
            || fnmatch(glob.c_str(), ProgramInvocationShortName(), FNM_PATHNAME) == 0
#elif defined(HAVE_SHLWAPI_H)
            || PathMatchSpec(glob.c_str(), ProgramInvocationName())
            || PathMatchSpec(glob.c_str(), ProgramInvocationShortName())
#endif
            ) {
          flags_are_relevant = true;
        }
      }
    }
  }
  return retval;
}